

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract(mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
          *this,demand_t *dest,duration_t empty_queue_timeout)

{
  extraction_status_t eVar1;
  long lVar2;
  anon_class_16_2_0c77c6cc __p;
  anon_class_16_2_0c77c6cc __p_00;
  bool queue_empty;
  unique_lock<std::mutex> lock;
  bool local_41;
  unique_lock<std::mutex> local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  local_40._M_device = &this->m_lock;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  local_41 = (this->m_queue).m_queue.
             super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             (this->m_queue).m_queue.
             super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_41) {
    eVar1 = chain_closed;
    if (this->m_status == closed) goto LAB_0020ec47;
    this->m_threads_to_wakeup = this->m_threads_to_wakeup + 1;
    if (empty_queue_timeout.__r == 0x7fffffffffffffff) {
      __p.queue_empty = &local_41;
      __p.this = this;
      std::condition_variable::
      wait<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (&this->m_underflow_cond,&local_40,__p);
    }
    else {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_30.__d.__r = (duration)(lVar2 + empty_queue_timeout.__r);
      __p_00.queue_empty = &local_41;
      __p_00.this = this;
      std::condition_variable::
      wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (&this->m_underflow_cond,&local_40,&local_30,__p_00);
    }
    this->m_threads_to_wakeup = this->m_threads_to_wakeup - 1;
  }
  if (local_41 == true) {
    eVar1 = (uint)(this->m_status != open) * 2;
  }
  else {
    eVar1 = extract_demand_from_not_empty_queue(this,dest);
  }
LAB_0020ec47:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return eVar1;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			duration_t empty_queue_timeout ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				// If queue is empty we must wait for some time.
				bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// Waiting for new messages has no sence because
							// chain is closed.
							return extraction_status_t::chain_closed;

						auto predicate = [this, &queue_empty]() -> bool {
								queue_empty = m_queue.is_empty();
								return !queue_empty ||
										details::status::closed == m_status;
							};

						// Count of sleeping thread must be incremented before
						// going to sleep and decremented right after.
						++m_threads_to_wakeup;
						auto decrement_threads = so_5::details::at_scope_exit(
								[this] { --m_threads_to_wakeup; } );

						if( !details::is_infinite_wait_timevalue( empty_queue_timeout ) )
							// A wait with finite timeout must be performed.
							m_underflow_cond.wait_for(
									lock, empty_queue_timeout, predicate );
						else
							// Wait until arrival of any message or closing of chain.
							m_underflow_cond.wait( lock, predicate );
					}

				// If queue is still empty nothing can be extracted and
				// we must stop operation.
				if( queue_empty )
					return details::status::open == m_status ?
							// The chain is still open so there must be this result
							extraction_status_t::no_messages :
							// The chain is closed and there must be different result
							extraction_status_t::chain_closed;

				return extract_demand_from_not_empty_queue( dest );
			}